

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void recfield(LexState *ls,ConsControl *cc)

{
  int iVar1;
  int a;
  FuncState *fs_00;
  int b;
  int c;
  undefined1 local_58 [4];
  int rkkey;
  expdesc val;
  expdesc key;
  int reg;
  FuncState *fs;
  ConsControl *cc_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  iVar1 = ls->fs->freereg;
  if ((ls->t).token == 0x11d) {
    if (0x7ffffffd < cc->nh) {
      errorlimit(fs_00,0x7ffffffd,"items in a constructor");
    }
    checkname(ls,(expdesc *)&val.t);
  }
  else {
    yindex(ls,(expdesc *)&val.t);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  b = luaK_exp2RK(fs_00,(expdesc *)&val.t);
  expr(ls,(expdesc *)local_58);
  a = (cc->t->u).s.info;
  c = luaK_exp2RK(fs_00,(expdesc *)local_58);
  luaK_codeABC(fs_00,OP_SETTABLE,a,b,c);
  fs_00->freereg = iVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, struct ConsControl *cc) {
  /* recfield -> (NAME | `['exp1`]') = exp1 */
  FuncState *fs = ls->fs;
  int reg = ls->fs->freereg;
  expdesc key, val;
  int rkkey;
  if (ls->t.token == TK_NAME) {
    luaY_checklimit(fs, cc->nh, MAX_INT, "items in a constructor");
    checkname(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  rkkey = luaK_exp2RK(fs, &key);
  expr(ls, &val);
  luaK_codeABC(fs, OP_SETTABLE, cc->t->u.s.info, rkkey, luaK_exp2RK(fs, &val));
  fs->freereg = reg;  /* free registers */
}